

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.h
# Opt level: O1

void __thiscall Memory::ReferencedArenaAdapter::DeleteArena(ReferencedArenaAdapter *this)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  bool bVar1;
  
  this->deleteFlag = true;
  bVar1 = CCLock::TryEnter(&(this->adapterLock).super_CCLock);
  if (bVar1) {
    if (this->strongRefCount == 0) {
      this_00 = &this->arena->
                 super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
                (this_00);
      HeapAllocator::Free(&HeapAllocator::Instance,this_00,0x80);
      this->arena = (ArenaAllocator *)0x0;
    }
    CCLock::Leave(&(this->adapterLock).super_CCLock);
    return;
  }
  return;
}

Assistant:

void DeleteArena()
    {
        deleteFlag = true;
        if (adapterLock.TryEnter())
        {
            if (0 == strongRefCount)
            {
                // All strong references are gone, delete the arena
                HeapDelete(this->arena);
                this->arena = NULL;
            }
            adapterLock.Leave();
        }
    }